

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::ConvertToGrayScale
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *inX;
  byte *pbVar6;
  uchar *puVar7;
  byte *pbVar8;
  uchar *puVar9;
  ulong uVar10;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  if (in->_colorCount == '\x01') {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
    return;
  }
  uVar4 = out->_rowSize;
  uVar5 = in->_rowSize;
  puVar9 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar4);
  pbVar8 = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar5);
  puVar7 = puVar9 + height * uVar4;
  for (; puVar9 != puVar7; puVar9 = puVar9 + uVar4) {
    pbVar6 = pbVar8;
    for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
      bVar3 = *pbVar6;
      pbVar1 = pbVar6 + 1;
      pbVar2 = pbVar6 + 2;
      pbVar6 = pbVar6 + 3;
      puVar9[uVar10] = (uchar)(((uint)*pbVar2 + (uint)*pbVar1 + (uint)bVar3) / 3);
    }
    pbVar8 = pbVar8 + uVar5;
  }
  return;
}

Assistant:

void ConvertToGrayScale( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                             uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( out );

        if( in.colorCount() == GRAY_SCALE ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, inX += colorCount )
                (*outX) = static_cast <uint8_t>((*(inX) + *(inX + 1) + *(inX + 2)) / 3u); // average of red, green and blue components
        }
    }